

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O0

void __thiscall Order_compond2_Test::TestBody(Order_compond2_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_128;
  AssertHelper local_108;
  Message local_100;
  ExprPtr local_f8;
  ExprPtr local_e8;
  ExprPtr local_d8;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_;
  ExprPtr n3;
  ExprPtr n1;
  string local_88;
  undefined1 local_68 [8];
  ExprPtr y;
  allocator<char> local_41;
  string local_40;
  undefined1 local_20 [8];
  ExprPtr x;
  Order_compond2_Test *this_local;
  
  x.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"x",&local_41);
  mathiu::impl::symbol((impl *)local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"y",
             (allocator<char> *)
             ((long)&n1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  mathiu::impl::symbol((impl *)local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&n1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  mathiu::impl::operator____i
            ((impl *)&n3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,1);
  mathiu::impl::operator____i((impl *)&gtest_ar_.message_,3);
  mathiu::impl::operator+
            ((impl *)&local_e8,
             (ExprPtr *)
             &n3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ExprPtr *)local_20);
  mathiu::impl::operator^((impl *)&local_d8,&local_e8,(ExprPtr *)&gtest_ar_.message_);
  mathiu::impl::operator+
            ((impl *)&local_f8,
             (ExprPtr *)
             &n3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ExprPtr *)local_68);
  local_c1 = mathiu::impl::less(&local_d8,&local_f8);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_f8);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_d8);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_c0,(AssertionResult *)"less((n1 + x)^n3, n1 + y)",
               "false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/order.cpp"
               ,0x69,message);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)&gtest_ar_.message_);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)
             &n3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_68);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_20);
  return;
}

Assistant:

TEST(Order, compond2)
{
    auto const x = symbol("x");
    auto const y = symbol("y");
    auto const n1 = 1_i;
    auto const n3 = 3_i;
    EXPECT_TRUE(less((n1 + x)^n3, n1 + y));
}